

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint lodepng_decode(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  byte *pbVar1;
  uint *data;
  LodePNGDecoderSettings *zlibsettings;
  LodePNGInfo *info;
  LodePNGColorMode *pLVar2;
  LodePNGColorMode *b;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  _func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr *p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uchar uVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uchar *puVar14;
  size_t sVar15;
  ulong uVar16;
  size_t sVar17;
  uchar *puVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uchar *out_00;
  ulong uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  size_t bytewidth;
  ulong uVar27;
  uint *puVar28;
  bool bVar29;
  ulong local_2c8;
  uchar *local_2b8;
  ulong local_2b0;
  uchar *local_278;
  size_t sStack_270;
  ulong local_268;
  undefined8 local_260;
  uint *local_258;
  byte *local_250;
  size_t *local_248;
  uchar **local_240;
  uint passh [7];
  uint passh_1 [7];
  uint passw_1 [7];
  uint passw [7];
  size_t local_1b8 [8];
  size_t local_178 [8];
  size_t padded_passstart [8];
  size_t filter_passstart [8];
  size_t padded_passstart_1 [8];
  size_t filter_passstart_1 [8];
  
  *out = (uchar *)0x0;
  *out = (uchar *)0x0;
  uVar11 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar11;
  local_258 = w;
  if (uVar11 == 0) {
    lVar26 = (ulong)*h * (ulong)*w;
    if (((*h == 0) || ((int)((ulong)lVar26 >> 0x20) == 0)) && ((uint)lVar26 < 0x10000000)) {
      puVar28 = (uint *)(in + 0x21);
      pLVar2 = &(state->info_png).color;
      info = &state->info_png;
      zlibsettings = &state->decoder;
      local_240 = (state->info_png).unknown_chunks_data;
      local_248 = (state->info_png).unknown_chunks_size;
      local_260 = 1;
      local_2b8 = (uchar *)0x0;
      local_2c8 = 0;
      local_2b0 = 0;
      bVar9 = false;
      bVar7 = false;
      do {
        if ((bVar7) || (state->error != 0)) break;
        pbVar1 = (byte *)((long)puVar28 + (0xc - (long)in));
        if (insize < pbVar1 || puVar28 < in) {
          state->error = 0x1e;
LAB_001115c5:
          iVar13 = 3;
          bVar7 = false;
        }
        else {
          uVar11 = (uint)(byte)*puVar28 << 0x18;
          if ((int)uVar11 < 0) {
            state->error = 0x3f;
            goto LAB_001115c5;
          }
          uVar27 = (ulong)((uint)*(byte *)((long)puVar28 + 3) |
                           (uint)*(byte *)((long)puVar28 + 1) << 0x10 |
                           (uint)*(byte *)((long)puVar28 + 2) << 8 | uVar11);
          if ((insize < pbVar1 + uVar27) || ((byte *)((long)puVar28 + uVar27 + 0xc) < in)) {
            state->error = 0x40;
LAB_001115ec:
            bVar7 = false;
            iVar13 = 3;
          }
          else {
            data = puVar28 + 2;
            uVar10 = lodepng_chunk_type_equals((uchar *)puVar28,"IDAT");
            if (uVar10 == '\0') {
              uVar10 = lodepng_chunk_type_equals((uchar *)puVar28,"IEND");
              if (uVar10 != '\0') {
                bVar7 = true;
                bVar8 = false;
                goto LAB_001116e7;
              }
              uVar10 = lodepng_chunk_type_equals((uchar *)puVar28,"PLTE");
              if (uVar10 == '\0') {
                uVar10 = lodepng_chunk_type_equals((uchar *)puVar28,"tRNS");
                if (uVar10 == '\0') {
                  uVar10 = lodepng_chunk_type_equals((uchar *)puVar28,"bKGD");
                  if (uVar10 == '\0') {
                    uVar10 = lodepng_chunk_type_equals((uchar *)puVar28,"tEXt");
                    if (uVar10 == '\0') {
                      uVar10 = lodepng_chunk_type_equals((uchar *)puVar28,"zTXt");
                      if (uVar10 != '\0') {
                        if ((state->decoder).read_text_chunks == 0) goto LAB_00111864;
                        uVar11 = readChunk_zTXt(info,&zlibsettings->zlibsettings,(uchar *)data,
                                                uVar27);
                        goto LAB_0011183b;
                      }
                      uVar10 = lodepng_chunk_type_equals((uchar *)puVar28,"iTXt");
                      if (uVar10 == '\0') {
                        uVar10 = lodepng_chunk_type_equals((uchar *)puVar28,"tIME");
                        if (uVar10 == '\0') {
                          uVar10 = lodepng_chunk_type_equals((uchar *)puVar28,"pHYs");
                          if (uVar10 == '\0') {
                            if ((puVar28[1] & 0x20) == 0) {
                              state->error = 0x45;
                              goto LAB_001115ec;
                            }
                            if ((state->decoder).remember_unknown_chunks == 0) {
                              bVar9 = true;
                              goto LAB_001119be;
                            }
                            uVar11 = (int)local_260 - 1;
                            uVar11 = lodepng_chunk_append
                                               (local_240 + uVar11,local_248 + uVar11,
                                                (uchar *)puVar28);
                            state->error = uVar11;
                            bVar9 = true;
                            goto joined_r0x001118cd;
                          }
                          uVar11 = readChunk_pHYs(info,(uchar *)data,uVar27);
                        }
                        else {
                          uVar11 = readChunk_tIME(info,(uchar *)data,uVar27);
                        }
                        state->error = uVar11;
                        bVar7 = false;
                        if (uVar11 != 0) goto LAB_001115ec;
                        bVar8 = true;
                        goto LAB_001116e7;
                      }
                      if ((state->decoder).read_text_chunks == 0) {
LAB_001119be:
                        bVar7 = false;
                        bVar8 = true;
                        goto LAB_001116e7;
                      }
                      uVar11 = readChunk_iTXt(info,&zlibsettings->zlibsettings,(uchar *)data,uVar27)
                      ;
                      state->error = uVar11;
                    }
                    else {
                      if ((state->decoder).read_text_chunks == 0) {
LAB_00111864:
                        bVar8 = true;
                        bVar7 = false;
                        goto LAB_001116e7;
                      }
                      uVar11 = readChunk_tEXt(info,(uchar *)data,uVar27);
LAB_0011183b:
                      state->error = uVar11;
                    }
joined_r0x001118cd:
                    bVar8 = true;
                    bVar7 = false;
                    iVar13 = 3;
                    if (uVar11 == 0) goto LAB_001116e7;
                    goto LAB_001115cc;
                  }
                  uVar11 = readChunk_bKGD(info,(uchar *)data,uVar27);
                }
                else {
                  uVar11 = readChunk_tRNS(pLVar2,(uchar *)data,uVar27);
                }
                state->error = uVar11;
                if (uVar11 != 0) goto LAB_001115ec;
              }
              else {
                uVar11 = readChunk_PLTE(pLVar2,(uchar *)data,uVar27);
                state->error = uVar11;
                if (uVar11 != 0) goto LAB_001115ec;
                local_260 = 2;
              }
              bVar7 = false;
              bVar8 = true;
            }
            else {
              uVar16 = local_2c8 + uVar27;
              if (local_2b0 < uVar16) {
                uVar19 = uVar16 * 3 >> 1;
                if (local_2b0 * 2 < uVar16) {
                  uVar19 = uVar16;
                }
                puVar14 = (uchar *)realloc(local_2b8,uVar19);
                bVar29 = puVar14 == (uchar *)0x0;
                if (!bVar29) {
                  local_2b0 = uVar19;
                  local_2b8 = puVar14;
                }
              }
              else {
                bVar29 = false;
              }
              if (bVar29) {
                state->error = 0x53;
                iVar13 = 3;
                uVar16 = local_2c8;
              }
              else {
                iVar13 = 0;
                local_260 = 3;
                if (uVar27 != 0) {
                  uVar19 = 0;
                  do {
                    local_2b8[uVar19 + local_2c8] = *(byte *)((long)data + uVar19);
                    uVar19 = uVar19 + 1;
                  } while (uVar27 != uVar19);
                }
              }
              local_2c8 = uVar16;
              bVar8 = true;
              bVar7 = false;
              if (bVar29) goto LAB_001115cc;
            }
LAB_001116e7:
            if (((state->decoder).ignore_crc != 0 || bVar9) ||
               (local_250 = (byte *)insize, uVar11 = lodepng_chunk_check_crc((uchar *)puVar28),
               insize = (size_t)local_250, uVar11 == 0)) {
              iVar13 = 0;
              if (bVar8) {
                uVar11 = *puVar28;
                puVar28 = (uint *)((long)puVar28 +
                                  (ulong)((uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 |
                                           (uVar11 & 0xff00) << 8 | uVar11 << 0x18) + 0xc));
              }
            }
            else {
              state->error = 0x39;
              iVar13 = 3;
              bVar9 = false;
            }
          }
        }
LAB_001115cc:
      } while (iVar13 == 0);
      puVar28 = local_258;
      local_278 = (uchar *)0x0;
      sStack_270 = 0;
      local_268 = 0;
      uVar11 = *local_258;
      if ((state->info_png).interlace_method == 0) {
        uVar12 = *h;
        sVar17 = lodepng_get_raw_size_idat(uVar11,uVar12,pLVar2);
        uVar27 = sVar17 + uVar12;
      }
      else {
        uVar12 = *h;
        uVar20 = uVar12 + 7 >> 3;
        sVar17 = lodepng_get_raw_size_idat(uVar11 + 7 >> 3,uVar20,pLVar2);
        lVar26 = sVar17 + uVar20;
        if (4 < uVar11) {
          sVar17 = lodepng_get_raw_size_idat(uVar11 + 3 >> 3,uVar20,pLVar2);
          lVar26 = lVar26 + (ulong)uVar20 + sVar17;
        }
        uVar20 = uVar12 + 3 >> 3;
        sVar17 = lodepng_get_raw_size_idat(uVar11 + 3 >> 2,uVar20,pLVar2);
        lVar26 = uVar20 + sVar17 + lVar26;
        if (2 < uVar11) {
          uVar20 = uVar12 + 3 >> 2;
          sVar17 = lodepng_get_raw_size_idat(uVar11 + 1 >> 2,uVar20,pLVar2);
          lVar26 = lVar26 + uVar20 + sVar17;
        }
        uVar20 = uVar12 + 1 >> 2;
        sVar17 = lodepng_get_raw_size_idat(uVar11 + 1 >> 1,uVar20,pLVar2);
        lVar26 = uVar20 + sVar17 + lVar26;
        if (1 < uVar11) {
          uVar20 = uVar12 + 1 >> 1;
          sVar17 = lodepng_get_raw_size_idat(uVar11 >> 1,uVar20,pLVar2);
          lVar26 = lVar26 + uVar20 + sVar17;
        }
        sVar17 = lodepng_get_raw_size_idat(uVar11,uVar12 >> 1,pLVar2);
        uVar27 = sVar17 + (uVar12 >> 1) + lVar26;
        puVar28 = local_258;
      }
      puVar14 = local_278;
      uVar16 = local_268;
      if ((state->error == 0) && (local_268 < uVar27)) {
        uVar16 = uVar27 * 3 >> 1;
        if (local_268 * 2 < uVar27) {
          uVar16 = uVar27;
        }
        puVar14 = (uchar *)realloc(local_278,uVar16);
        if (puVar14 == (uchar *)0x0) {
          state->error = 0x53;
          puVar14 = local_278;
          uVar16 = local_268;
        }
      }
      local_268 = uVar16;
      local_278 = puVar14;
      if (state->error == 0) {
        p_Var6 = (state->decoder).zlibsettings.custom_zlib;
        if (p_Var6 == (_func_uint_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_LodePNGDecompressSettings_ptr
                       *)0x0) {
          uVar11 = lodepng_zlib_decompress
                             (&local_278,&sStack_270,local_2b8,local_2c8,&zlibsettings->zlibsettings
                             );
        }
        else {
          uVar11 = (*p_Var6)(&local_278,&sStack_270,local_2b8,local_2c8,&zlibsettings->zlibsettings)
          ;
        }
        state->error = uVar11;
        uVar12 = 0x5b;
        if (sStack_270 == uVar27) {
          uVar12 = uVar11;
        }
        if (uVar11 != 0) {
          uVar12 = uVar11;
        }
        state->error = uVar12;
      }
      free(local_2b8);
      if (state->error == 0) {
        sVar17 = lodepng_get_raw_size(*puVar28,*h,pLVar2);
        puVar14 = (uchar *)malloc(sVar17);
        *out = puVar14;
        if (puVar14 == (uchar *)0x0) {
          state->error = 0x53;
        }
      }
      else {
        sVar17 = 0;
      }
      puVar14 = local_278;
      if (state->error == 0) {
        if (sVar17 != 0) {
          sVar15 = 0;
          do {
            (*out)[sVar15] = '\0';
            sVar15 = sVar15 + 1;
          } while (sVar17 != sVar15);
        }
        uVar27 = (ulong)(state->info_png).color.colortype;
        iVar13 = 0;
        if (uVar27 < 7) {
          iVar13 = *(int *)(&DAT_001231d4 + uVar27 * 4);
        }
        uVar11 = iVar13 * (state->info_png).color.bitdepth;
        if (uVar11 == 0) {
          uVar12 = 0x1f;
        }
        else {
          puVar18 = *out;
          uVar20 = *puVar28;
          uVar24 = *h;
          if ((state->info_png).interlace_method == 0) {
            if (uVar11 < 8) {
              uVar25 = uVar11 * uVar20;
              uVar21 = uVar25 + 7 & 0xfffffff8;
              if (uVar25 == uVar21) goto LAB_00111ddf;
              uVar12 = unfilter(local_278,local_278,uVar20,uVar24,uVar11);
              if (uVar12 != 0) goto LAB_0011205a;
              removePaddingBits(puVar18,puVar14,(ulong)uVar25,(ulong)uVar21,uVar24);
            }
            else {
LAB_00111ddf:
              uVar12 = unfilter(puVar18,local_278,uVar20,uVar24,uVar11);
              if (uVar12 != 0) goto LAB_0011205a;
            }
LAB_00112053:
            uVar12 = 0;
          }
          else {
            Adam7_getpassvalues(passw,passh,filter_passstart,padded_passstart,local_178,uVar20,
                                uVar24,uVar11);
            out_00 = puVar14 + padded_passstart[0];
            uVar12 = unfilter(out_00,puVar14 + filter_passstart[0],passw[0],passh[0],uVar11);
            if (uVar12 == 0) {
              local_2b0._0_4_ = passh[0];
              lVar26 = 0;
              uVar25 = passw[0];
              do {
                if (uVar11 < 8) {
                  removePaddingBits(puVar14 + *(long *)((long)local_178 + lVar26 * 2),out_00,
                                    (ulong)(uVar25 * uVar11),
                                    (ulong)(uVar25 * uVar11 + 7 & 0xfffffff8),(uint)local_2b0);
                }
                if (lVar26 == 0x18) {
                  Adam7_getpassvalues(passw_1,passh_1,filter_passstart_1,padded_passstart_1,
                                      local_1b8,uVar20,uVar24,uVar11);
                  if (uVar11 < 8) {
                    lVar26 = 0;
                    do {
                      uVar12 = passh_1[lVar26];
                      if (uVar12 != 0) {
                        uVar24 = passw_1[lVar26];
                        uVar25 = 0;
                        do {
                          if ((ulong)uVar24 != 0) {
                            sVar17 = local_1b8[lVar26];
                            uVar21 = ADAM7_DY[lVar26];
                            uVar3 = ADAM7_IY[lVar26];
                            uVar4 = ADAM7_DX[lVar26];
                            uVar5 = ADAM7_IX[lVar26];
                            uVar27 = 0;
                            do {
                              uVar19 = (ulong)((uVar4 * (int)uVar27 +
                                               (uVar21 * uVar25 + uVar3) * uVar20 + uVar5) * uVar11)
                              ;
                              uVar16 = (ulong)((uVar25 * uVar24 + (int)uVar27) * uVar11) +
                                       sVar17 * 8;
                              uVar23 = uVar11;
                              do {
                                if ((puVar14[uVar16 >> 3] >> (~(byte)uVar16 & 7) & 1) != 0) {
                                  puVar18[uVar19 >> 3] =
                                       puVar18[uVar19 >> 3] | '\x01' << (~(byte)uVar19 & 7);
                                }
                                uVar19 = uVar19 + 1;
                                uVar16 = uVar16 + 1;
                                uVar23 = uVar23 - 1;
                              } while (uVar23 != 0);
                              uVar27 = uVar27 + 1;
                            } while (uVar27 != uVar24);
                          }
                          uVar25 = uVar25 + 1;
                        } while (uVar25 != uVar12);
                      }
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 7);
                  }
                  else {
                    uVar27 = (ulong)(uVar11 >> 3);
                    lVar26 = 0;
                    do {
                      uVar11 = passh_1[lVar26];
                      if (uVar11 != 0) {
                        uVar12 = passw_1[lVar26];
                        uVar16 = 0;
                        uVar24 = 0;
                        do {
                          iVar13 = (int)uVar16;
                          if ((ulong)uVar12 != 0) {
                            uVar25 = ADAM7_DX[lVar26];
                            uVar21 = (ADAM7_DY[lVar26] * uVar24 + ADAM7_IY[lVar26]) * uVar20 +
                                     ADAM7_IX[lVar26];
                            sVar17 = local_1b8[lVar26];
                            uVar19 = 0;
                            do {
                              uVar22 = 0;
                              do {
                                puVar18[uVar22 + uVar21 * uVar27] =
                                     puVar14[uVar22 + uVar16 * uVar27 + sVar17];
                                uVar22 = uVar22 + 1;
                              } while (uVar27 != uVar22);
                              uVar19 = uVar19 + 1;
                              uVar21 = uVar21 + uVar25;
                              uVar16 = (ulong)((int)uVar16 + 1);
                            } while (uVar19 != uVar12);
                          }
                          uVar24 = uVar24 + 1;
                          uVar16 = (ulong)(iVar13 + uVar12);
                        } while (uVar24 != uVar11);
                      }
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 7);
                  }
                  goto LAB_00112053;
                }
                out_00 = puVar14 + *(long *)((long)padded_passstart + lVar26 * 2 + 8);
                uVar25 = *(uint *)((long)passw + lVar26 + 4);
                local_2b0._0_4_ = *(uint *)((long)passh + lVar26 + 4);
                uVar12 = unfilter(out_00,puVar14 + *(long *)((long)filter_passstart + lVar26 * 2 + 8
                                                            ),uVar25,(uint)local_2b0,uVar11);
                lVar26 = lVar26 + 4;
              } while (uVar12 == 0);
            }
          }
        }
LAB_0011205a:
        state->error = uVar12;
      }
      sStack_270 = 0;
      local_268 = 0;
      free(local_278);
      local_278 = (uchar *)0x0;
    }
    else {
      state->error = 0x5c;
    }
  }
  if (state->error != 0) {
    return state->error;
  }
  uVar11 = (state->decoder).color_convert;
  if (uVar11 != 0) {
    pLVar2 = &state->info_raw;
    b = &(state->info_png).color;
    iVar13 = lodepng_color_mode_equal(pLVar2,b);
    puVar28 = local_258;
    if (iVar13 == 0) {
      puVar14 = *out;
      if (((pLVar2->colortype | LCT_GREY_ALPHA) != LCT_RGBA) && ((state->info_raw).bitdepth != 8)) {
        return 0x38;
      }
      sVar17 = lodepng_get_raw_size(*local_258,*h,pLVar2);
      puVar18 = (uchar *)malloc(sVar17);
      *out = puVar18;
      if (puVar18 == (uchar *)0x0) {
        uVar11 = 0x53;
      }
      else {
        uVar11 = lodepng_convert(puVar18,puVar14,pLVar2,b,*puVar28,*h);
      }
      state->error = uVar11;
      free(puVar14);
      goto LAB_00112168;
    }
    if (uVar11 != 0) goto LAB_00112168;
  }
  uVar11 = lodepng_color_mode_copy(&state->info_raw,&(state->info_png).color);
  state->error = uVar11;
  if (uVar11 != 0) {
    return uVar11;
  }
LAB_00112168:
  return state->error;
}

Assistant:

unsigned lodepng_decode(unsigned char** out, unsigned* w, unsigned* h,
	LodePNGState* state,
	const unsigned char* in, size_t insize)
{
	*out = 0;
	decodeGeneric(out, w, h, state, in, insize);
	if (state->error) return state->error;
	if (!state->decoder.color_convert || lodepng_color_mode_equal(&state->info_raw, &state->info_png.color))
	{
		/*same color type, no copying or converting of data needed*/
		/*store the info_png color settings on the info_raw so that the info_raw still reflects what colortype
		the raw image has to the end user*/
		if (!state->decoder.color_convert)
		{
			state->error = lodepng_color_mode_copy(&state->info_raw, &state->info_png.color);
			if (state->error) return state->error;
		}
	}
	else
	{
		/*color conversion needed; sort of copy of the data*/
		unsigned char* data = *out;
		size_t outsize;

		/*TODO: check if this works according to the statement in the documentation: "The converter can convert
		from greyscale input color type, to 8-bit greyscale or greyscale with alpha"*/
		if (!(state->info_raw.colortype == LCT_RGB || state->info_raw.colortype == LCT_RGBA)
			&& !(state->info_raw.bitdepth == 8))
		{
			return 56; /*unsupported color mode conversion*/
		}

		outsize = lodepng_get_raw_size(*w, *h, &state->info_raw);
		*out = (unsigned char*)lodepng_malloc(outsize);
		if (!(*out))
		{
			state->error = 83; /*alloc fail*/
		}
		else state->error = lodepng_convert(*out, data, &state->info_raw,
			&state->info_png.color, *w, *h);
		lodepng_free(data);
	}
	return state->error;
}